

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O3

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_ileaveBytes_dileaveBytes_random_::run
          (Test_bitileave_ileaveBytes_dileaveBytes_random_ *this)

{
  string_view msg;
  SourceLocation loc;
  uint64_t bytes;
  char *pcVar1;
  long *plVar2;
  uint uVar3;
  size_type *psVar4;
  ulong count;
  long lVar5;
  uint uVar6;
  char *bytes_00;
  ulong uVar7;
  uint64_t dileaved;
  uint64_t bytesAsInt;
  size_t in_stack_fffffffffffffee0;
  char *local_110;
  _Alloc_hider local_108;
  size_type local_100;
  char local_f8 [8];
  undefined8 in_stack_ffffffffffffff10;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar7 = 0x3039;
  lVar5 = 0x4000;
  uVar6 = 0;
  while( true ) {
    uVar7 = uVar7 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
    uVar3 = uVar6 + ((uVar6 & 0xffff) / 9) * -9;
    count = (ulong)(uVar3 & 0xffff);
    bytes_00 = (char *)0x0;
    if ((((uVar6 & 0xffff) / 9) * 9 + (int)lVar5 & 0xffff) != 0x4000) {
      bytes_00 = (char *)(uVar7 >> ((char)uVar3 * -8 & 0x3fU));
    }
    local_110 = bytes_00;
    bytes = detail::ileaveBytes_jmp((uint64_t)bytes_00,count);
    pcVar1 = (char *)detail::dileaveBytes_jmp(bytes,count);
    if (pcVar1 != bytes_00) break;
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + -1;
    if (lVar5 == 0) {
      return;
    }
  }
  detail::stringify_impl<unsigned_long>(&local_90,(unsigned_long *)&stack0xfffffffffffffee8);
  std::operator+(&local_70,"Comparison failed: dileaved == bytesAsInt (with \"dileaved\"=",&local_90
                );
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_108._M_p = (pointer)*plVar2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_108._M_p == psVar4) {
    local_f8 = (char  [8])*psVar4;
    in_stack_ffffffffffffff10 = plVar2[3];
    local_108._M_p = local_f8;
  }
  else {
    local_f8 = (char  [8])*psVar4;
  }
  local_100 = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  detail::stringify_impl<unsigned_long>(&local_b0,(unsigned_long *)&local_110);
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108,
                 &local_b0);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  *plVar2 = (long)(plVar2 + 2);
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  msg._M_str = pcVar1;
  msg._M_len = in_stack_fffffffffffffee0;
  loc.function = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp";
  loc.file = (char *)in_stack_ffffffffffffff10;
  loc.line = (unsigned_long)"run";
  assertFail(msg,loc);
}

Assistant:

BITMANIP_TEST(bitileave, ileaveBytes_dileaveBytes_random)
{
    constexpr size_t iterations = 1024 * 16;

    fast_rng64 rng{12345};
    std::uniform_int_distribution<std::uint64_t> distr;

    for (size_t i = 0; i < iterations; ++i) {
        std::uint8_t count = i % 9;
        std::uint64_t next = distr(rng);
        std::uint64_t bytesAsInt = count == 0 ? 0 : next >> ((8 - count) * 8);

        std::uint64_t ileaved = ileaveBytes(bytesAsInt, count);
        std::uint64_t dileaved = dileave_bytes(ileaved, count);

        BITMANIP_ASSERT_EQ(dileaved, bytesAsInt);
    }
}